

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::AddExtraSites(S2Builder *this,MutableS2ShapeIndex *input_edge_index)

{
  InputEdgeId e;
  ulong uVar1;
  vector<int,_std::allocator<int>_> snap_queue;
  vector<int,_std::allocator<int>_> chain;
  int local_7c;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  vector<int,_std::allocator<int>_> local_58;
  double local_38;
  
  local_38 = (this->site_snap_radius_ca_).length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_58,0.0);
  if ((local_38 !=
       (double)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start) ||
     (NAN(local_38) ||
      NAN((double)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start))) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    uVar1 = 0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68 = (int *)0x0;
    local_78 = (int *)0x0;
    iStack_70._M_current = (int *)0x0;
    local_7c = 0;
    if ((this->input_edges_).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->input_edges_).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if (iStack_70._M_current == local_68) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_7c);
        }
        else {
          *iStack_70._M_current = (int)uVar1;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        while (local_78 != iStack_70._M_current) {
          e = iStack_70._M_current[-1];
          iStack_70._M_current = iStack_70._M_current + -1;
          SnapEdge(this,e,&local_58);
          MaybeAddExtraSites(this,e,local_7c,&local_58,input_edge_index,
                             (vector<int,_std::allocator<int>_> *)&local_78);
        }
        uVar1 = (long)local_7c + 1;
        local_7c = (int)uVar1;
      } while (uVar1 < (ulong)((long)(this->input_edges_).
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->input_edges_).
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_78 != (int *)0x0) {
      operator_delete(local_78);
    }
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void S2Builder::AddExtraSites(const MutableS2ShapeIndex& input_edge_index) {
  // When options_.split_crossing_edges() is true, this function may be called
  // even when site_snap_radius_ca_ == 0 (because edge_snap_radius_ca_ > 0).
  // However neither of the conditions above apply in that case.
  if (site_snap_radius_ca_ == S1ChordAngle::Zero()) return;

  vector<SiteId> chain;  // Temporary
  vector<InputEdgeId> snap_queue;
  for (InputEdgeId max_e = 0; max_e < input_edges_.size(); ++max_e) {
    snap_queue.push_back(max_e);
    while (!snap_queue.empty()) {
      InputEdgeId e = snap_queue.back();
      snap_queue.pop_back();
      SnapEdge(e, &chain);
      // We could save the snapped chain here in a snapped_chains_ vector, to
      // avoid resnapping it in AddSnappedEdges() below, however currently
      // SnapEdge only accounts for less than 5% of the runtime.
      MaybeAddExtraSites(e, max_e, chain, input_edge_index, &snap_queue);
    }
  }
}